

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::DestroyAll
          (SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> *this)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  reference ppvVar5;
  byte bVar6;
  uint uVar7;
  char *End;
  pair<void_*,_unsigned_long> *PtrAndSize;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  anon_class_1_0_00000001 local_31 [8];
  anon_class_1_0_00000001 DestroyElements;
  
  lVar10 = *(long *)(this + 0x10);
  uVar1 = *(uint *)(this + 0x18);
  for (lVar9 = 0; (ulong)uVar1 << 3 != lVar9; lVar9 = lVar9 + 8) {
    lVar2 = *(long *)(this + 0x10);
    pcVar4 = (char *)alignAddr(*(void **)(lVar10 + lVar9),(Align)0x3);
    pvVar3 = *(void **)(lVar10 + lVar9);
    ppvVar5 = SmallVectorTemplateCommon<void_*,_void>::back
                        ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
    if (pvVar3 == *ppvVar5) {
      End = *(char **)this;
    }
    else {
      uVar7 = (uint)((ulong)((lVar10 + lVar9) - lVar2) >> 10) & 0x1ffffff;
      bVar6 = (byte)uVar7;
      if (0x1d < uVar7) {
        bVar6 = 0x1e;
      }
      End = (char *)((0x1000L << (bVar6 & 0x3f)) + *(long *)(lVar10 + lVar9));
    }
    DestroyAll::anon_class_1_0_00000001::operator()(local_31,pcVar4,End);
  }
  puVar8 = *(undefined8 **)(this + 0x40);
  for (lVar10 = (ulong)*(uint *)(this + 0x48) << 4; lVar10 != 0; lVar10 = lVar10 + -0x10) {
    pvVar3 = (void *)*puVar8;
    lVar9 = puVar8[1];
    pcVar4 = (char *)alignAddr(pvVar3,(Align)0x3);
    DestroyAll::anon_class_1_0_00000001::operator()(local_31,pcVar4,(char *)(lVar9 + (long)pvVar3));
    puVar8 = puVar8 + 2;
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
            ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)this);
  return;
}

Assistant:

void DestroyAll() {
    auto DestroyElements = [](char *Begin, char *End) {
      assert(Begin == (char *)alignAddr(Begin, Align::Of<T>()));
      for (char *Ptr = Begin; Ptr + sizeof(T) <= End; Ptr += sizeof(T))
        reinterpret_cast<T *>(Ptr)->~T();
    };

    for (auto I = Allocator.Slabs.begin(), E = Allocator.Slabs.end(); I != E;
         ++I) {
      size_t AllocatedSlabSize = BumpPtrAllocator::computeSlabSize(
          std::distance(Allocator.Slabs.begin(), I));
      char *Begin = (char *)alignAddr(*I, Align::Of<T>());
      char *End = *I == Allocator.Slabs.back() ? Allocator.CurPtr
                                               : (char *)*I + AllocatedSlabSize;

      DestroyElements(Begin, End);
    }

    for (auto &PtrAndSize : Allocator.CustomSizedSlabs) {
      void *Ptr = PtrAndSize.first;
      size_t Size = PtrAndSize.second;
      DestroyElements((char *)alignAddr(Ptr, Align::Of<T>()),
                      (char *)Ptr + Size);
    }

    Allocator.Reset();
  }